

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSender.cpp
# Opt level: O0

void __thiscall MyServerConnection::StartSending(MyServerConnection *this)

{
  TonkFile pTVar1;
  OutputWorker *this_00;
  SDKConnection *in_RDI;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  char *in_stack_fffffffffffff978;
  LogStringBuffer *in_stack_fffffffffffff980;
  TonkConnection in_stack_fffffffffffff988;
  Channel *pCVar2;
  LogStringBuffer *in_stack_fffffffffffff9b8;
  OutputWorker *in_stack_fffffffffffff9c0;
  undefined1 local_578 [16];
  ostream aoStack_568 [376];
  string *local_3f0;
  char *local_3e8;
  undefined4 local_3dc;
  Channel *local_3d8;
  string *local_3d0;
  char *local_3c8;
  undefined8 local_3c0;
  undefined1 *local_3b8;
  Channel *local_3b0;
  undefined8 local_3a8;
  undefined1 *local_3a0;
  Channel *local_398;
  string *local_390;
  char *local_388;
  undefined1 *local_380;
  Channel *local_378;
  undefined8 local_370;
  undefined1 *local_368;
  char *local_360;
  undefined1 *local_358;
  Channel *local_350;
  string *local_348;
  undefined1 *local_340;
  Channel *local_338;
  string *local_330;
  undefined1 *local_328;
  char *local_320;
  undefined1 *local_318;
  char *local_310;
  string *local_308;
  char *local_300;
  undefined4 local_2f4;
  Channel *local_2f0;
  undefined4 local_2e4;
  Channel *local_2e0;
  undefined1 local_2c8 [16];
  ostream aoStack_2b8 [376];
  char *local_140;
  string *local_138;
  char *local_130;
  undefined4 local_124;
  Channel *local_120;
  char *local_118;
  string *local_110;
  char *local_108;
  undefined8 local_100;
  undefined1 *local_f8;
  Channel *local_f0;
  undefined8 local_e8;
  undefined1 *local_e0;
  Channel *local_d8;
  undefined8 local_d0;
  undefined1 *local_c8;
  char *local_c0;
  string *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  Channel *local_a0;
  char *local_98;
  undefined1 *local_90;
  Channel *local_88;
  char *local_80;
  string *local_78;
  undefined1 *local_70;
  Channel *local_68;
  string *local_60;
  undefined1 *local_58;
  Channel *local_50;
  string *local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  Channel *local_18;
  char *local_10;
  undefined1 *local_8;
  
  tonk::SDKConnection::GetRawConnection(in_RDI);
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  pTVar1 = tonk_file_from_disk(in_stack_fffffffffffff988,
                               (uint32_t)((ulong)in_stack_fffffffffffff980 >> 0x20),
                               in_stack_fffffffffffff978,(char *)0x103591);
  in_RDI[1].super_enable_shared_from_this<tonk::SDKConnection>._M_weak_this.
  super___weak_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pTVar1;
  if (in_RDI[1].super_enable_shared_from_this<tonk::SDKConnection>._M_weak_this.
      super___weak_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_3f0 = (string *)(in_RDI[1]._vptr_SDKConnection + 0x11);
    if ((int)Logger.ChannelMinLevel < 5) {
      local_3d8 = &Logger;
      local_3dc = 4;
      local_3e8 = "Failed to map source file ";
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff980,in_stack_fffffffffffff978,Trace);
      local_3c0 = 0x116318;
      local_3b0 = &Logger;
      local_3c8 = local_3e8;
      local_3d0 = local_3f0;
      local_398 = &Logger;
      local_3b8 = local_578;
      local_3a8 = local_3c0;
      local_3a0 = local_578;
      local_370 = local_3c0;
      local_368 = local_578;
      std::operator<<(aoStack_568,(string *)&Logger.Prefix);
      local_378 = &Logger;
      local_380 = local_3b8;
      local_388 = local_3c8;
      local_390 = local_3d0;
      local_350 = &Logger;
      local_358 = local_3b8;
      local_360 = local_3c8;
      local_318 = local_3b8;
      local_320 = local_3c8;
      std::operator<<((ostream *)(local_3b8 + 0x10),local_3c8);
      local_338 = &Logger;
      local_340 = local_380;
      local_348 = local_390;
      local_328 = local_380;
      local_330 = local_390;
      std::operator<<((ostream *)(local_380 + 0x10),local_390);
      this_00 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_00,in_stack_fffffffffffff9b8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1038f9);
    }
  }
  else {
    local_308 = (string *)(in_RDI[1]._vptr_SDKConnection + 0x11);
    local_2f0 = &Logger;
    local_2f4 = 1;
    local_300 = "Successfully mapped ";
    local_310 = " for file data";
    local_2e0 = &Logger;
    local_2e4 = 1;
    if ((int)Logger.ChannelMinLevel < 2) {
      local_120 = &Logger;
      local_124 = 1;
      local_130 = "Successfully mapped ";
      local_140 = " for file data";
      local_138 = local_308;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff980,in_stack_fffffffffffff978,Trace);
      local_100 = 0x116318;
      local_f0 = &Logger;
      local_108 = local_130;
      local_110 = local_138;
      local_118 = local_140;
      local_d8 = &Logger;
      local_f8 = local_2c8;
      local_e8 = local_100;
      local_e0 = local_2c8;
      local_d0 = local_100;
      local_c8 = local_2c8;
      std::operator<<(aoStack_2b8,(string *)&Logger.Prefix);
      local_a0 = &Logger;
      local_a8 = local_f8;
      local_b0 = local_108;
      local_b8 = local_110;
      local_c0 = local_118;
      local_88 = &Logger;
      local_90 = local_f8;
      local_98 = local_108;
      local_30 = local_f8;
      local_38 = local_108;
      std::operator<<((ostream *)(local_f8 + 0x10),local_108);
      local_68 = &Logger;
      local_70 = local_a8;
      local_78 = local_b8;
      local_80 = local_c0;
      pCVar2 = &Logger;
      local_50 = &Logger;
      local_58 = local_a8;
      local_60 = local_b8;
      local_40 = local_a8;
      local_48 = local_b8;
      std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
      local_20 = local_70;
      local_28 = local_80;
      local_8 = local_70;
      local_10 = local_80;
      local_18 = pCVar2;
      std::operator<<((ostream *)(local_70 + 0x10),local_80);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x103d45);
    }
    tonk_file_send((TonkFile)0x103d56);
  }
  return;
}

Assistant:

void MyServerConnection::StartSending()
{
    File = tonk_file_from_disk(
        GetRawConnection(),
        TonkChannel_LowPri0,
        Server->FileSendName.c_str(),
        Server->FileSendPath.c_str());

    if (File == nullptr) {
        Logger.Error("Failed to map source file ", Server->FileSendPath);
        return;
    }

    Logger.Debug("Successfully mapped ", Server->FileSendPath, " for file data");

    tonk_file_send(File);
}